

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O2

void __thiscall Printer::Print(Printer *this,ostream *c,char *data)

{
  uint uVar1;
  DataAttrInfo *pDVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  int maxLength;
  char str [53];
  char strSpace [50];
  
  if (data != (char *)0x0) {
    this->iCount = this->iCount + 1;
    lVar6 = 0;
    for (lVar5 = 0; lVar5 < this->attrCount; lVar5 = lVar5 + 1) {
      pDVar2 = this->attributes;
      if (*(int *)(pDVar2->attrName + lVar6 + 0x1f) == 2) {
        str[0x20] = '\0';
        str[0x21] = '\0';
        str[0x22] = '\0';
        str[0x23] = '\0';
        str[0x24] = '\0';
        str[0x25] = '\0';
        str[0x26] = '\0';
        str[0x27] = '\0';
        str[0x28] = '\0';
        str[0x29] = '\0';
        str[0x2a] = '\0';
        str[0x2b] = '\0';
        str[0x2c] = '\0';
        str[0x10] = '\0';
        str[0x11] = '\0';
        str[0x12] = '\0';
        str[0x13] = '\0';
        str[0x14] = '\0';
        str[0x15] = '\0';
        str[0x16] = '\0';
        str[0x17] = '\0';
        str[0x18] = '\0';
        str[0x19] = '\0';
        str[0x1a] = '\0';
        str[0x1b] = '\0';
        str[0x1c] = '\0';
        str[0x1d] = '\0';
        str[0x1e] = '\0';
        str[0x1f] = '\0';
        str[0] = '\0';
        str[1] = '\0';
        str[2] = '\0';
        str[3] = '\0';
        str[4] = '\0';
        str[5] = '\0';
        str[6] = '\0';
        str[7] = '\0';
        str[8] = '\0';
        str[9] = '\0';
        str[10] = '\0';
        str[0xb] = '\0';
        str[0xc] = '\0';
        str[0xd] = '\0';
        str[0xe] = '\0';
        str[0xf] = '\0';
        str[0x2d] = '\0';
        str[0x2e] = '\0';
        str[0x2f] = '\0';
        str[0x30] = '\0';
        str[0x31] = '\0';
        str[0x32] = '\0';
        str[0x33] = '\0';
        str[0x34] = '\0';
        if ((long)*(int *)(pDVar2->attrName + lVar6 + 0x23) < 0x36) {
          strncpy(str,data + *(int *)(pDVar2->attrName + lVar6 + 0x1b),
                  (long)*(int *)(pDVar2->attrName + lVar6 + 0x23));
          std::operator<<(c,str);
          maxLength = *(int *)(this->attributes->attrName + lVar6 + 0x23);
          sVar3 = strlen(this->psHeader[lVar5]);
          sVar4 = strlen(str);
          if (maxLength < (int)sVar3) {
            maxLength = (int)sVar3;
          }
          Spaces(maxLength,(int)sVar4);
        }
        else {
          strncpy(str,data + *(int *)(pDVar2->attrName + lVar6 + 0x1b),0x34);
          str[0x32] = '.';
          str[0x33] = '.';
          std::operator<<(c,str);
          sVar3 = strlen(str);
          Spaces(0x35,(int)sVar3);
        }
      }
      if (*(int *)(this->attributes->attrName + lVar6 + 0x1f) == 0) {
        uVar1 = *(uint *)(data + *(int *)(this->attributes->attrName + lVar6 + 0x1b));
        sprintf(strSpace,"%d",(ulong)uVar1);
        std::ostream::operator<<(c,uVar1);
        sVar3 = strlen(this->psHeader[lVar5]);
        if (sVar3 < 0xd) {
          sVar3 = 0xc;
        }
        sVar4 = strlen(strSpace);
        Spaces((int)sVar3,(int)sVar4);
      }
      if (*(int *)(this->attributes->attrName + lVar6 + 0x1f) == 1) {
        sprintf(strSpace,"%f",
                SUB84((double)*(float *)(data + *(int *)(this->attributes->attrName + lVar6 + 0x1b))
                      ,0));
        std::operator<<(c,strSpace);
        sVar3 = strlen(this->psHeader[lVar5]);
        if (sVar3 < 0xd) {
          sVar3 = 0xc;
        }
        sVar4 = strlen(strSpace);
        Spaces((int)sVar3,(int)sVar4);
      }
      lVar6 = lVar6 + 0x44;
    }
    std::operator<<(c,"\n");
  }
  return;
}

Assistant:

void Printer::Print(ostream &c, const char * const data)
{
    char str[MAXPRINTSTRING], strSpace[50];
    int i, a;
    float b;

    if (data == NULL)
        return;

    // Increment the number of tuples printed
    iCount++;

    for (i = 0; i<attrCount; i++) {
        if (attributes[i].attrType == STRING) {
            // We will only print out the first MAXNAME+10 characters of
            // the string value.
            memset(str,0,MAXPRINTSTRING);

            if (attributes[i].attrLength>MAXPRINTSTRING) {
                strncpy(str, data+attributes[i].offset, MAXPRINTSTRING-1);
                str[MAXPRINTSTRING-3] ='.';
                str[MAXPRINTSTRING-2] ='.';
                c << str;
                Spaces(MAXPRINTSTRING, strlen(str));
            } else {
                strncpy(str, data+attributes[i].offset, attributes[i].attrLength);
                c << str;
                if (attributes[i].attrLength < (int) strlen(psHeader[i]))
                    Spaces(strlen(psHeader[i]), strlen(str));
                else
                    Spaces(attributes[i].attrLength, strlen(str));
            }
        }
        if (attributes[i].attrType == INT) {
            memcpy (&a, (data+attributes[i].offset), sizeof(int));
            sprintf(strSpace, "%d",a);
            c << a;
            if (strlen(psHeader[i]) < 12)
                Spaces(12, strlen(strSpace));
            else
                Spaces(strlen(psHeader[i]), strlen(strSpace));
        }
        if (attributes[i].attrType == FLOAT) {
            memcpy (&b, (data+attributes[i].offset), sizeof(float));
            sprintf(strSpace, "%f",b);
            c << strSpace;
            if (strlen(psHeader[i]) < 12)
                Spaces(12, strlen(strSpace));
            else
                Spaces(strlen(psHeader[i]), strlen(strSpace));
        }
    }
    c << "\n";
}